

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ValidateReadBuffer
          (ComputeShaderBase *this,int x,int y,int w,int h,vec4 *expected)

{
  uint uVar1;
  undefined4 in_register_0000000c;
  pointer epsilon;
  uint uVar2;
  ComputeShaderBase *this_00;
  int iVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  allocator_type local_71;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  vec4 *local_60;
  ulong local_58;
  pointer local_50;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  
  local_60 = (vec4 *)CONCAT44(in_register_0000000c,w);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&display,(long)(y * x),&local_71);
  iVar3 = 0;
  epsilon = display.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,x,y,0x1908,0x1406,
             display.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  local_50 = display.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_58 = 0;
  if (0 < x) {
    local_58 = (ulong)(uint)x;
  }
  uVar1 = 0;
  if (0 < y) {
    uVar1 = y;
  }
  uVar2 = 0;
  local_70 = y;
  local_68 = x;
  do {
    if (uVar2 == uVar1) {
LAB_009ca59e:
      bVar6 = local_70 <= (int)uVar2;
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&display.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return bVar6;
    }
    iVar4 = 1;
    uVar5 = local_58;
    local_6c = uVar2;
    local_64 = iVar3;
    while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
      this_00 = (ComputeShaderBase *)(local_50 + iVar3);
      bVar6 = ColorEqual(this_00,local_60,&this->g_color_eps,epsilon);
      uVar2 = local_6c;
      iVar4 = iVar4 + -1;
      iVar3 = iVar3 + 1;
      if (!bVar6) {
        anon_unknown_0::Output
                  ("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n",
                   (double)*(float *)&(this_00->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper,
                   (double)*(float *)((long)&(this_00->super_SubcaseBase).super_GLWrapper.
                                             _vptr_GLWrapper + 4),
                   (double)*(float *)&(this_00->super_SubcaseBase).super_GLWrapper.
                                      super_CallLogWrapper.m_gl,
                   (double)*(float *)((long)&(this_00->super_SubcaseBase).super_GLWrapper.
                                             super_CallLogWrapper.m_gl + 4),
                   (double)local_60->m_data[0],(double)local_60->m_data[1],
                   (double)local_60->m_data[2],(double)local_60->m_data[3],(ulong)(uint)-iVar4,
                   (ulong)local_6c);
        goto LAB_009ca59e;
      }
    }
    uVar2 = local_6c + 1;
    iVar3 = local_64 + local_68;
  } while( true );
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		std::vector<vec4> display(w * h);
		glReadPixels(x, y, w, h, GL_RGBA, GL_FLOAT, &display[0]);

		for (int j = 0; j < h; ++j)
		{
			for (int i = 0; i < w; ++i)
			{
				if (!ColorEqual(display[j * w + i], expected, g_color_eps))
				{
					Output("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n", x + i, y + j,
						   display[j * w + i].x(), display[j * w + i].y(), display[j * w + i].z(),
						   display[j * w + i].w(), expected.x(), expected.y(), expected.z(), expected.w());
					return false;
				}
			}
		}

		return true;
	}